

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall Net::read_with_retry(Net *this,string *data)

{
  int iVar1;
  ostream *poVar2;
  char local_38 [4];
  int ret;
  char r [32];
  string *data_local;
  Net *this_local;
  
  r._24_8_ = data;
  iVar1 = BIO_read((BIO *)this->sock,local_38,0x20);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"recv error(conn closed)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->closed = 1;
  }
  else if ((iVar1 < 0) && (iVar1 = BIO_test_flags((BIO *)this->sock,8), iVar1 == 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"recv error");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this->closed = 1;
  }
  else {
    std::__cxx11::string::operator+=((string *)r._24_8_,local_38);
  }
  return;
}

Assistant:

void Net::read_with_retry(std::string &data){
	char r[32];
	int ret;
	ret=BIO_read(sock,r,32);
	if(ret==0){
		std::cout<<"recv error(conn closed)"<<std::endl;
		closed=1;
		return;
	} else if(ret<0)
		if(!BIO_should_retry(sock)){
			std::cout<<"recv error"<<std::endl;
			closed=1;
			return;
		}
	data+=r;
}